

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_MuxStructPrint_rec(Gia_Man_t *p,int iObj,int fFirst)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pObj_00;
  int iCtrl;
  Gia_Obj_t *pObj;
  int fFirst_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  if ((fFirst == 0) &&
     ((iVar1 = Gia_ObjIsMuxId(p,iObj), iVar1 == 0 || (iVar1 = Gia_ObjRefNumId(p,iObj), 0 < iVar1))))
  {
    uVar2 = Gia_ObjLevelId(p,iObj);
    printf("<%02d>",(ulong)uVar2);
    return;
  }
  uVar2 = Gia_ObjFaninId2p(p,pObj_00);
  printf(" [(");
  iVar1 = Gia_ObjIsMuxId(p,uVar2);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjRefNumId(p,uVar2), iVar1 != 0)) {
    printf("%d",(ulong)uVar2);
    uVar2 = Gia_ObjLevelId(p,uVar2);
    printf("<%d>",(ulong)uVar2);
  }
  else {
    Gia_MuxStructPrint_rec(p,uVar2,0);
  }
  printf(")");
  iVar1 = Gia_ObjFaninC2(p,pObj_00);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjFaninId1p(p,pObj_00);
    Gia_MuxStructPrint_rec(p,iVar1,0);
    printf("|");
    iVar1 = Gia_ObjFaninId0p(p,pObj_00);
    Gia_MuxStructPrint_rec(p,iVar1,0);
    printf("]");
  }
  else {
    iVar1 = Gia_ObjFaninId0p(p,pObj_00);
    Gia_MuxStructPrint_rec(p,iVar1,0);
    printf("|");
    iVar1 = Gia_ObjFaninId1p(p,pObj_00);
    Gia_MuxStructPrint_rec(p,iVar1,0);
    printf("]");
  }
  return;
}

Assistant:

void Gia_MuxStructPrint_rec( Gia_Man_t * p, int iObj, int fFirst )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int iCtrl;
    if ( !fFirst && (!Gia_ObjIsMuxId(p, iObj) || Gia_ObjRefNumId(p, iObj) > 0) )
    {
//        printf( "%d", iObj );
        printf( "<%02d>", Gia_ObjLevelId(p, iObj) );
        return;
    }
    iCtrl = Gia_ObjFaninId2p(p, pObj);
    printf( " [(" );
    if ( Gia_ObjIsMuxId(p, iCtrl) && Gia_ObjRefNumId(p, iCtrl) == 0 )
        Gia_MuxStructPrint_rec( p, iCtrl, 0 );
    else
    {
        printf( "%d", iCtrl );
        printf( "<%d>", Gia_ObjLevelId(p, iCtrl) );
    }
    printf( ")" );
    if ( Gia_ObjFaninC2(p, pObj) )
    {
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId0p(p, pObj), 0 );
        printf( "|" );
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId1p(p, pObj), 0 );
        printf( "]" );
    }
    else
    {
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId1p(p, pObj), 0 );
        printf( "|" );
        Gia_MuxStructPrint_rec( p, Gia_ObjFaninId0p(p, pObj), 0 );
        printf( "]" );
    }
}